

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScriptContext.cpp
# Opt level: O0

PropertyString * __thiscall
Js::ScriptContext::AddPropertyString2(ScriptContext *this,PropertyRecord *propString)

{
  uint i_00;
  uint uVar1;
  char16 *pcVar2;
  Cache *pCVar3;
  PropertyStringMap **ppPVar4;
  PropertyStringMap *pPVar5;
  PropertyString **ppPVar6;
  JavascriptLibrary *this_00;
  PropertyString *ptr;
  uint j;
  uint i;
  char16 *buf;
  PropertyRecord *propString_local;
  ScriptContext *this_local;
  
  pcVar2 = PropertyRecord::GetBuffer(propString);
  i_00 = PropertyStringMap::PStrMapIndex(*pcVar2);
  pCVar3 = Cache(this);
  ppPVar4 = Memory::WriteBarrierPtr::operator_cast_to_PropertyStringMap__
                      ((WriteBarrierPtr *)(pCVar3->propertyStrings + i_00));
  if (*ppPVar4 == (PropertyStringMap *)0x0) {
    InitPropertyStringMap(this,i_00);
  }
  uVar1 = PropertyStringMap::PStrMapIndex(pcVar2[1]);
  pCVar3 = Cache(this);
  pPVar5 = Memory::WriteBarrierPtr<Js::PropertyStringMap>::operator->
                     (pCVar3->propertyStrings + i_00);
  ppPVar6 = Memory::WriteBarrierPtr::operator_cast_to_PropertyString__
                      ((WriteBarrierPtr *)(pPVar5->strLen2 + uVar1));
  if ((*ppPVar6 == (PropertyString *)0x0) && (((this->super_ScriptContextBase).isClosed & 1U) == 0))
  {
    this_00 = GetLibrary(this);
    ptr = JavascriptLibrary::CreatePropertyString(this_00,propString);
    pCVar3 = Cache(this);
    pPVar5 = Memory::WriteBarrierPtr<Js::PropertyStringMap>::operator->
                       (pCVar3->propertyStrings + i_00);
    Memory::WriteBarrierPtr<Js::PropertyString>::operator=(pPVar5->strLen2 + uVar1,ptr);
    TrackPid(this,propString);
  }
  pCVar3 = Cache(this);
  pPVar5 = Memory::WriteBarrierPtr<Js::PropertyStringMap>::operator->
                     (pCVar3->propertyStrings + i_00);
  ppPVar6 = Memory::WriteBarrierPtr::operator_cast_to_PropertyString__
                      ((WriteBarrierPtr *)(pPVar5->strLen2 + uVar1));
  return *ppPVar6;
}

Assistant:

PropertyString* ScriptContext::AddPropertyString2(const Js::PropertyRecord* propString)
    {
        const char16* buf = propString->GetBuffer();
        const uint i = PropertyStringMap::PStrMapIndex(buf[0]);
        if (this->Cache()->propertyStrings[i] == NULL)
        {
            InitPropertyStringMap(i);
        }
        const uint j = PropertyStringMap::PStrMapIndex(buf[1]);
        if (this->Cache()->propertyStrings[i]->strLen2[j] == NULL && !isClosed)
        {
            this->Cache()->propertyStrings[i]->strLen2[j] = GetLibrary()->CreatePropertyString(propString);
            this->TrackPid(propString);
        }
        return this->Cache()->propertyStrings[i]->strLen2[j];
    }